

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

Result wabt::ParseFloat(LiteralType literal_type,char *s,char *end,uint32_t *out_bits)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  Result RVar7;
  char *pcVar8;
  char *pcVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  byte *pbVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  byte *pbVar20;
  
  switch(literal_type) {
  case Int:
  case Float:
    RVar7 = anon_unknown_0::FloatParser<float>::ParseFloat(s,end,out_bits);
    return (Result)RVar7.enum_;
  case Hexfloat:
    break;
  case Infinity:
    pcVar14 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar14 < end) {
      pcVar8 = "inf" + ((long)end - (long)pcVar14);
      lVar19 = 0;
      do {
        if (lVar19 == 3) goto LAB_0017825f;
        if (pcVar14[lVar19] != "inf"[lVar19]) goto LAB_00178516;
        lVar5 = lVar19 + 1;
        lVar19 = lVar19 + 1;
      } while (pcVar14 + lVar5 != end);
    }
    else {
      pcVar8 = "inf";
    }
    if (*pcVar8 != '\0') {
LAB_00178516:
      __assert_fail("StringStartsWith(s, end, \"inf\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                    ,0x1a4,
                    "static void wabt::(anonymous namespace)::FloatParser<float>::ParseInfinity(const char *, const char *, Uint *) [T = float]"
                   );
    }
LAB_0017825f:
    *out_bits = (uint)(*s != '-') * -0x80000000 - 0x800000;
    return (Result)Ok;
  case Nan:
    pcVar14 = s + ((*s - 0x2bU & 0xfd) == 0);
    if (pcVar14 < end) {
      pcVar8 = "nan" + ((long)end - (long)pcVar14);
      lVar19 = 0;
      do {
        if (lVar19 == 3) goto LAB_001780f3;
        if (pcVar14[lVar19] != "nan"[lVar19]) goto LAB_001784d8;
        lVar5 = lVar19 + 1;
        lVar19 = lVar19 + 1;
      } while (pcVar14 + lVar5 != end);
    }
    else {
      pcVar8 = "nan";
    }
    if (*pcVar8 != '\0') {
LAB_001784d8:
      __assert_fail("StringStartsWith(s, end, \"nan\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                    ,0xd9,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                   );
    }
LAB_001780f3:
    pcVar8 = pcVar14 + 3;
    if (pcVar8 == end) {
      uVar16 = 0x400000;
LAB_0017830c:
      *out_bits = ((uint)(*s != '-') * -0x80000000 + uVar16) - 0x800000;
      return (Result)Ok;
    }
    if (pcVar8 < end) {
      pcVar9 = ":0x" + ((long)end - (long)pcVar8);
      lVar19 = 0;
      do {
        if (lVar19 == 3) goto LAB_00178291;
        if (pcVar8[lVar19] != ":0x"[lVar19]) goto LAB_00178535;
        lVar5 = lVar19 + 1;
        lVar19 = lVar19 + 1;
      } while (pcVar8 + lVar5 != end);
    }
    else {
      pcVar9 = ":0x";
    }
    if (*pcVar9 != '\0') {
LAB_00178535:
      __assert_fail("StringStartsWith(s, end, \":0x\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                    ,0xdf,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                   );
    }
LAB_00178291:
    pcVar14 = pcVar14 + 6;
    if (end <= pcVar14) {
      return (Result)Error;
    }
    uVar16 = 0;
    do {
      iVar17 = (int)*pcVar14;
      if (iVar17 != 0x5f) {
        uVar18 = iVar17 - 0x30;
        if (9 < uVar18) {
          if (iVar17 - 0x61U < 6) {
            uVar18 = iVar17 - 0x57;
          }
          else {
            if (5 < iVar17 - 0x41U) {
              return (Result)Error;
            }
            uVar18 = iVar17 - 0x37;
          }
        }
        uVar16 = uVar16 * 0x10 + uVar18;
        if (0x7fffff < uVar16) {
          return (Result)Error;
        }
      }
      pcVar14 = pcVar14 + 1;
    } while (pcVar14 < end);
    if (uVar16 == 0) {
      return (Result)Error;
    }
    if (uVar16 < 0x800000) goto LAB_0017830c;
    goto LAB_00178559;
  default:
    abort();
  }
  cVar1 = *s;
  pcVar14 = s + ((cVar1 - 0x2bU & 0xfd) == 0);
  if (pcVar14 < end) {
    pcVar8 = end + (long)(":0x" + (1 - (long)pcVar14));
    lVar19 = 0;
    do {
      if (lVar19 == 2) goto LAB_00178155;
      if (pcVar14[lVar19] != ":0x"[lVar19 + 1]) goto LAB_001784f7;
      lVar5 = lVar19 + 1;
      lVar19 = lVar19 + 1;
    } while (pcVar14 + lVar5 != end);
  }
  else {
    pcVar8 = "0x";
  }
  if (*pcVar8 != '\0') {
LAB_001784f7:
    __assert_fail("StringStartsWith(s, end, \"0x\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                  ,0x107,
                  "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                 );
  }
LAB_00178155:
  pbVar15 = (byte *)(pcVar14 + 2);
  if (pbVar15 < end) {
    bVar2 = false;
    iVar17 = 0;
    uVar16 = 0;
    bVar4 = false;
    bVar3 = false;
    do {
      bVar10 = *pbVar15;
      iVar11 = iVar17;
      if (bVar10 == 0x2e) {
        bVar2 = true;
      }
      else if (bVar10 != 0x5f) {
        iVar11 = (int)(char)bVar10;
        uVar18 = iVar11 - 0x30;
        if (9 < uVar18) {
          if (iVar11 - 0x61U < 6) {
            uVar18 = iVar11 - 0x57;
          }
          else {
            if (5 < iVar11 - 0x41U) {
              if (uVar16 == 0) goto LAB_001784bf;
              if ((bVar10 | 0x20) != 0x70) {
                __assert_fail("*s == \'p\' || *s == \'P\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                              ,0x137,
                              "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                             );
              }
              bVar10 = pbVar15[1];
              iVar11 = 0;
              pbVar20 = pbVar15 + 1;
              iVar13 = 0;
              if (bVar10 == 0x2b) {
                pbVar20 = pbVar15 + 2;
                iVar13 = iVar17;
              }
              if (bVar10 == 0x2d) {
                pbVar20 = pbVar15 + 2;
                iVar13 = -iVar17;
              }
              if (end <= pbVar20) goto LAB_001784b1;
              iVar11 = 0;
              goto LAB_00178485;
            }
            uVar18 = iVar11 - 0x37;
          }
        }
        if (uVar16 < 0x1000000) {
          uVar16 = uVar16 * 0x10 + uVar18;
          iVar11 = iVar17 + -4;
          if (!bVar2) {
            iVar11 = iVar17;
          }
        }
        else {
          bVar3 = true;
          if (uVar18 == 0) {
            bVar3 = bVar4;
          }
          if (bVar4) {
            bVar3 = bVar4;
          }
          iVar11 = iVar17 + 4;
          bVar4 = bVar3;
          if (bVar2) {
            iVar11 = iVar17;
          }
        }
      }
      iVar17 = iVar11;
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 < end);
    iVar13 = 0;
    if (uVar16 != 0) goto LAB_00178202;
  }
  goto LAB_001784bf;
LAB_00178485:
  do {
    if ((char)*pbVar20 != 0x5f) {
      uVar18 = (int)(char)*pbVar20 - 0x30;
      if (9 < uVar18) {
        __assert_fail("digit <= 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                      ,0x14c,
                      "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                     );
      }
      iVar11 = uVar18 + iVar11 * 10;
      if (0x7f < iVar11 + iVar13) break;
    }
    pbVar20 = pbVar20 + 1;
  } while (pbVar20 != (byte *)end);
LAB_001784b1:
  iVar13 = -iVar11;
  if (bVar10 != 0x2d) {
    iVar13 = iVar11;
  }
LAB_00178202:
  uVar18 = 0x1f;
  if (uVar16 != 0) {
    for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
    }
  }
  uVar18 = uVar18 ^ 0x1f;
  iVar11 = iVar13 + (iVar17 - uVar18);
  uVar12 = iVar13 + (iVar17 - uVar18) + 0x1f;
  cVar6 = (char)uVar18;
  if (-0x7f < (int)uVar12) {
    if (uVar16 < 0x1000000) {
      if (uVar18 != 8) {
        uVar16 = uVar16 << (cVar6 - 8U & 0x1f);
      }
    }
    else {
      iVar13 = 1 << (7U - cVar6 & 0x1f);
      iVar17 = 0;
      if (bVar3) {
        iVar17 = iVar13;
      }
      if ((uVar16 >> ((byte)(8U - cVar6) & 0x1f) & 1) != 0) {
        iVar17 = iVar13;
      }
      uVar16 = iVar17 + uVar16 >> (8U - cVar6 & 0x1f);
      if (0xffffff < uVar16) {
        uVar12 = iVar11 + 0x20;
      }
    }
    if (0x7f < (int)uVar12) {
      return (Result)Error;
    }
    uVar16 = uVar12 * 0x800000 + 0x3f800000 | (uint)(cVar1 == '-') << 0x1f | uVar16 & 0x7fffff;
    goto LAB_001784ce;
  }
  if (uVar16 < 0x800000) {
    if (uVar18 != 9) {
      uVar16 = uVar16 << (cVar6 - 9U & 0x1f);
    }
  }
  else {
    bVar3 = (bool)(bVar3 | (uVar16 & ~(-1 << (8U - cVar6 & 0x1f))) != 0);
    uVar16 = uVar16 >> (9U - cVar6 & 0x1f);
  }
  if (0xffffff69 < uVar12) {
    if (uVar12 != 0xffffff81) {
      bVar10 = 0x61 - (char)iVar11;
      iVar13 = 1 << (bVar10 & 0x1f);
      iVar17 = 0;
      if (bVar3) {
        iVar17 = iVar13;
      }
      if ((uVar16 & (~(-1 << (bVar10 & 0x1f)) | 1 << (-iVar11 - 0x9eU & 0x1f))) != 0) {
        iVar17 = iVar13;
      }
      uVar16 = iVar17 + uVar16 >> ((byte)(-iVar11 - 0x9eU) & 0x1f) & 0x7fffff;
    }
    if (uVar16 != 0) {
      if (0x7fffff < uVar16) {
LAB_00178559:
        __assert_fail("sig <= Traits::kSigMask",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/literal.cc"
                      ,0xb9,
                      "static typename FloatParser<T>::Uint wabt::(anonymous namespace)::FloatParser<float>::Make(bool, int, Uint) [T = float]"
                     );
      }
      uVar16 = uVar16 | (uint)(cVar1 == '-') << 0x1f;
      goto LAB_001784ce;
    }
  }
LAB_001784bf:
  uVar16 = (uint)(cVar1 == '-') << 0x1f;
LAB_001784ce:
  *out_bits = uVar16;
  return (Result)Ok;
}

Assistant:

Result FloatParser<T>::Parse(LiteralType literal_type,
                             const char* s,
                             const char* end,
                             Uint* out_bits) {
#if COMPILER_IS_MSVC
  if (literal_type == LiteralType::Int && StringStartsWith(s, end, "0x")) {
    // Some MSVC crt implementation of strtof doesn't support hex strings
    literal_type = LiteralType::Hexfloat;
  }
#endif
  switch (literal_type) {
    case LiteralType::Int:
    case LiteralType::Float:
      return ParseFloat(s, end, out_bits);

    case LiteralType::Hexfloat:
      return ParseHex(s, end, out_bits);

    case LiteralType::Infinity:
      ParseInfinity(s, end, out_bits);
      return Result::Ok;

    case LiteralType::Nan:
      return ParseNan(s, end, out_bits);
  }

  WABT_UNREACHABLE;
}